

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ChainPromiseNode::ChainPromiseNode
          (ChainPromiseNode *this,Own<kj::_::PromiseNode> *innerParam)

{
  PromiseNode *pPVar1;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR___cxa_pure_virtual_003a3a88;
  Event::Event(&this->super_Event);
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_003a3890;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_003a38c8;
  *(undefined4 *)&(this->super_Event).field_0x24 = 0;
  pPVar1 = innerParam->ptr;
  (this->inner).disposer = innerParam->disposer;
  (this->inner).ptr = pPVar1;
  innerParam->ptr = (PromiseNode *)0x0;
  this->onReadyEvent = (Event *)0x0;
  this->selfPtr = (Own<kj::_::PromiseNode> *)0x0;
  pPVar1 = (this->inner).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ChainPromiseNode::ChainPromiseNode(Own<PromiseNode> innerParam)
    : state(STEP1), inner(kj::mv(innerParam)) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}